

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O1

void __thiscall
diy::Master::iexchange<bool(*)(Block*,diy::Master::ProxyWithLink_const&)>
          (Master *this,_func_bool_Block_ptr_ProxyWithLink_ptr **f,MemoryManagement *mem)

{
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_80;
  code *local_70;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (_func_bool_Block_ptr_ProxyWithLink_ptr *)0x0;
  local_a8._8_8_ = 0;
  if (*f != (_func_bool_Block_ptr_ProxyWithLink_ptr *)0x0) {
    pcStack_90 = std::
                 _Function_handler<bool_(Block_*,_const_diy::Master::ProxyWithLink_&),_bool_(*)(Block_*,_const_diy::Master::ProxyWithLink_&)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<bool_(Block_*,_const_diy::Master::ProxyWithLink_&),_bool_(*)(Block_*,_const_diy::Master::ProxyWithLink_&)>
               ::_M_manager;
    local_a8._M_unused._0_8_ = (undefined8)*f;
  }
  std::function<char_*(int,_unsigned_long)>::function
            ((function<char_*(int,_unsigned_long)> *)&local_80,&mem->allocate);
  std::function<void_(const_char_*)>::function
            ((function<void_(const_char_*)> *)&local_60,&mem->deallocate);
  std::function<void_(char_*,_const_char_*,_unsigned_long)>::function
            ((function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_40,&mem->copy);
  iexchange_<Block>(this,(ICallback<Block> *)&local_a8,(MemoryManagement *)&local_80);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  return;
}

Assistant:

void          iexchange(const F& f, MemoryManagement mem = MemoryManagement())
      {
          using Block = typename detail::block_traits<F>::type;
          iexchange_<Block>(f, mem);
      }